

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

void __thiscall vectorgraphics::TikzPlotter::makePDF(TikzPlotter *this,path *path,string *name)

{
  bool bVar1;
  ostream *__os;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  string local_1a0 [32];
  undefined1 local_180 [40];
  string local_158;
  path local_138;
  path local_110;
  string local_e8 [32];
  undefined1 local_c8 [96];
  undefined1 local_68 [8];
  path full_tex_path;
  string tex_name;
  string *name_local;
  path *path_local;
  TikzPlotter *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &full_tex_path._M_cmpts,name,".tex");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)(local_c8 + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &full_tex_path._M_cmpts,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_68,path,(path *)(local_c8 + 0x38));
  std::filesystem::__cxx11::path::~path((path *)(local_c8 + 0x38));
  std::filesystem::create_directories(path);
  std::filesystem::__cxx11::path::path((path *)local_c8,path);
  std::__cxx11::string::string(local_e8,(string *)name);
  cleanup((TikzPlotter *)local_c8,(EVP_PKEY_CTX *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::filesystem::__cxx11::path::~path((path *)local_c8);
  std::filesystem::__cxx11::path::path(&local_110,(path *)local_68);
  bVar1 = createTexFile(this,&local_110);
  std::filesystem::__cxx11::path::~path(&local_110);
  if (bVar1) {
    std::filesystem::__cxx11::path::path(&local_138,path);
    std::__cxx11::string::string((string *)(local_180 + 0x28),(string *)name);
    bVar1 = compileTexFile(this,&local_138,(string *)(local_180 + 0x28));
    std::__cxx11::string::~string((string *)(local_180 + 0x28));
    std::filesystem::__cxx11::path::~path(&local_138);
    if (bVar1) {
      __os = std::operator<<((ostream *)&std::cout,"makePDF: PDF succesfully created at ");
      this_00 = std::filesystem::__cxx11::operator<<(__os,(path *)local_68);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  std::filesystem::__cxx11::path::path((path *)local_180,path);
  std::__cxx11::string::string(local_1a0,(string *)name);
  cleanup((TikzPlotter *)local_180,(EVP_PKEY_CTX *)local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::filesystem::__cxx11::path::~path((path *)local_180);
  std::filesystem::__cxx11::path::~path((path *)local_68);
  std::__cxx11::string::~string((string *)&full_tex_path._M_cmpts);
  return;
}

Assistant:

void TikzPlotter::makePDF(std::filesystem::path path, std::string name) {
    std::string tex_name = name + ".tex";
    std::filesystem::path full_tex_path = path / tex_name;

    // create directories
    std::filesystem::create_directories(path);

    // clean up before, in case there are some left over files
    cleanup(path, name);

    if (createTexFile(full_tex_path)) {
      if (compileTexFile(path, name)) {
        std::cout << "makePDF: PDF succesfully created at " << full_tex_path << std::endl;
      }
    }

    // clean up after
    cleanup(path, name);
  }